

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

Object * resolveRoutineCall(Object *__return_storage_ptr__,Call c,Environment *env)

{
  char *identifer;
  Object value;
  Environment *env_00;
  Object *extraout_RAX;
  long lVar1;
  Routine r;
  Routine local_e8;
  Object local_b0;
  Object local_70;
  
  env_routine_get(&local_e8,c.identifer,c.line,globalEnv);
  if (local_e8.arity == c.argCount) {
    env_00 = env_new(globalEnv);
    if (0 < local_e8.arity) {
      lVar1 = 0;
      do {
        identifer = local_e8.arguments[lVar1];
        resolveExpression(&local_b0,c.arguments[lVar1],env);
        value.field_1.instance = local_b0.field_1.instance;
        value.type = local_b0.type;
        value._4_4_ = local_b0._4_4_;
        value.field_1._8_8_ = local_b0.field_1._8_8_;
        value.field_1._16_8_ = local_b0.field_1._16_8_;
        value.field_1.routine.arguments = local_b0.field_1.routine.arguments;
        value.field_1._32_8_ = local_b0.field_1._32_8_;
        value.field_1.container.constructor.statements =
             local_b0.field_1.container.constructor.statements;
        value.field_1.routine.code.statements = local_b0.field_1.routine.code.statements;
        env_put(identifer,c.line,value,env_00);
        lVar1 = lVar1 + 1;
      } while (lVar1 < local_e8.arity);
    }
    if (local_e8.isNative == 1) {
      handle_native(&local_70,c,env_00);
    }
    else {
      executeBlock(&local_70,local_e8.code,env_00);
    }
    *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x28) =
         local_70.field_1.container.constructor.statements;
    *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x30) =
         local_70.field_1.routine.code.statements;
    (__return_storage_ptr__->field_1).routine.arguments = local_70.field_1.routine.arguments;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_70.field_1._32_8_;
    (__return_storage_ptr__->field_1).literal.field_2 = local_70.field_1.literal.field_2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_70.field_1._16_8_;
    __return_storage_ptr__->type = local_70.type;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_70._4_4_;
    (__return_storage_ptr__->field_1).instance = local_70.field_1.instance;
    if (ret == '\x01') {
      ret = '\0';
    }
    env_free(env_00);
    return extraout_RAX;
  }
  printf("\x1b[31m\n[Runtime Error] [Line:%d] Argument count mismatch for routine %s! Expected : %d Received %d!\x1b[0m"
         ,(ulong)(uint)c.line,c.identifer);
  putchar(10);
  unload_all();
  exit(1);
}

Assistant:

static Object resolveRoutineCall(Call c, Environment *env){
    Routine r = env_routine_get(c.identifer, c.line, globalEnv);
    //printf("\nResolving call to %s", c.identifer);
    if(r.arity != c.argCount){
        printf(runtime_error("Argument count mismatch for routine %s! Expected : %d Received %d!"), 
                c.line, c.identifer, r.arity, c.argCount);
        stop();
        return nullObject;
    }
    Environment *routineEnv = env_new(globalEnv);
    int i = 0;
    // printf("\n[Call] Executing %s Arity : %d\n", r.name, r.arity);
    while(i < r.arity){
        //   printf(debug("Argument %s"), r.arguments[i]);
        env_put(r.arguments[i], c.line, resolveExpression(c.arguments[i], env), routineEnv);
        i++;
    }
    Object obj;
    if(r.isNative == 1)
        obj = handle_native(c, routineEnv);
    // printf("\n[Call] Executing %s\n", r.name);
    else
        obj = executeBlock(r.code, routineEnv);
    if(ret)
        ret = 0;
    env_free(routineEnv);
    return obj;
}